

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void CPP::WriteInitialization::addQtFlagsInitializer
               (Item *item,DomPropertyMap *properties,QString *name,int column)

{
  bool bVar1;
  DomProperty *pDVar2;
  undefined4 in_ECX;
  QString *in_RDX;
  undefined8 in_RSI;
  QStringBuilder<QString_&,_QString_&> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_QString_&> QVar3;
  DomProperty *p;
  QString v;
  QString orOperator;
  DomProperty *in_stack_ffffffffffffff28;
  QString *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 translatable;
  undefined4 in_stack_ffffffffffffff48;
  int column_00;
  QStringBuilder<QString_&,_QString_&> *name_00;
  Item *in_stack_ffffffffffffff68;
  QChar local_52;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined2 local_32;
  char16_t local_30;
  QString *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  column_00 = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = QHash<QString,_DomProperty_*>::value
                     ((QHash<QString,_DomProperty_*> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      in_stack_ffffffffffffff30);
  if (pDVar2 != (DomProperty *)0x0) {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    local_32 = 0x7c;
    QVar3 = ::operator+((char16_t *)in_stack_ffffffffffffff30,
                        &in_stack_ffffffffffffff28->m_attr_name);
    translatable = (undefined1)((ulong)pDVar2 >> 0x38);
    local_28 = QVar3.b;
    local_30 = QVar3.a;
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<char16_t,_QString_&> *)in_stack_ffffffffffffff28);
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    DomProperty::elementSet(in_stack_ffffffffffffff28);
    bVar1 = QString::isEmpty((QString *)0x13fadb);
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_52,L'|');
      QString::replace((QChar)(char16_t)&local_50,(QString *)(ulong)(ushort)local_52.ucs,
                       (CaseSensitivity)&local_20);
      name_00 = in_RDI;
      ::operator+(in_RDX,(QString *)in_RDI);
      ::QStringBuilder::operator_cast_to_QString(in_RDI);
      QString::QString((QString *)0x13fb69);
      addInitializer(in_stack_ffffffffffffff68,(QString *)name_00,column_00,in_RDX,
                     (QString *)CONCAT44(in_ECX,in_stack_ffffffffffffff48),(bool)translatable);
      QString::~QString((QString *)0x13fb92);
      QString::~QString((QString *)0x13fb9c);
    }
    QString::~QString((QString *)0x13fba9);
    QString::~QString((QString *)0x13fbb6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addQtFlagsInitializer(Item *item, const DomPropertyMap &properties,
                                                const QString &name, int column)
{
    if (const DomProperty *p = properties.value(name)) {
        const QString orOperator = u'|' + language::qtQualifier;
        QString v = p->elementSet();
        if (!v.isEmpty()) {
            v.replace(u'|', orOperator);
            addInitializer(item, name, column, language::qtQualifier + v);
        }
    }
}